

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

uint64_t __thiscall fmp4_stream::tfhd::size(tfhd *this)

{
  return (ulong)((uint)(this->super_full_box).super_box.has_uuid_ * 0x10 +
                (uint)(this->super_full_box).super_box.is_large_ * 8) +
         (ulong)(byte)(this->super_full_box).field_0x6c * 8 +
         (ulong)(this->sample_description_index_ != 0) * 4 +
         (ulong)(byte)(this->super_full_box).field_0x6e * 4 +
         (ulong)(byte)(this->super_full_box).field_0x6f * 4 +
         (ulong)this->default_sample_flags_present_ * 4 + 0x10;
}

Assistant:

uint64_t box::size()  const {
		uint64_t l_size = 8;
		if (is_large_)
			l_size += 8;
		if (has_uuid_)
			l_size += 16;
		return l_size;
	}